

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t
exr_get_tile_descriptor
          (exr_const_context_t_conflict ctxt,int part_index,uint32_t *xsize,uint32_t *ysize,
          exr_tile_level_mode_t *level,exr_tile_round_mode_t *round)

{
  undefined4 *puVar1;
  undefined4 *in_RCX;
  undefined4 *in_RDX;
  int in_ESI;
  char *in_RDI;
  uint *in_R8;
  int *in_R9;
  exr_attr_tiledesc_t *out;
  exr_const_priv_part_t part;
  exr_const_context_t_conflict in_stack_ffffffffffffffc0;
  exr_const_context_t_conflict c;
  exr_result_t local_4;
  
  if (in_RDI == (char *)0x0) {
    local_4 = 2;
  }
  else {
    if (*in_RDI == '\x01') {
      internal_exr_lock(in_stack_ffffffffffffffc0);
    }
    if ((in_ESI < 0) || (*(int *)(in_RDI + 0xc4) <= in_ESI)) {
      if (*in_RDI == '\x01') {
        internal_exr_unlock(in_stack_ffffffffffffffc0);
      }
      local_4 = (**(code **)(in_RDI + 0x48))(in_RDI,4,"Part index (%d) out of range",in_ESI);
    }
    else {
      c = *(exr_const_context_t_conflict *)(*(long *)(in_RDI + 0x1d8) + (long)in_ESI * 8);
      if (c->free_fn == (exr_memory_free_func_t)0x0) {
        if (*in_RDI == '\x01') {
          internal_exr_unlock(c);
        }
        local_4 = 0xf;
      }
      else {
        puVar1 = *(undefined4 **)(c->free_fn + 0x18);
        if (*(int *)(c->free_fn + 0x14) == 0x15) {
          if (in_RDX != (undefined4 *)0x0) {
            *in_RDX = *puVar1;
          }
          if (in_RCX != (undefined4 *)0x0) {
            *in_RCX = puVar1[1];
          }
          if (in_R8 != (uint *)0x0) {
            *in_R8 = *(byte *)(puVar1 + 2) & 0xf;
          }
          if (in_R9 != (int *)0x0) {
            *in_R9 = (int)(uint)*(byte *)(puVar1 + 2) >> 4;
          }
          if (*in_RDI == '\x01') {
            internal_exr_unlock(c);
          }
          local_4 = 0;
        }
        else {
          if (*in_RDI == '\x01') {
            internal_exr_unlock(c);
          }
          local_4 = (**(code **)(in_RDI + 0x48))
                              (in_RDI,6,"Invalid required attribute type \'%s\' for \'tiles\'",
                               *(undefined8 *)(c->free_fn + 8));
        }
      }
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_get_tile_descriptor (
    exr_const_context_t    ctxt,
    int                    part_index,
    uint32_t*              xsize,
    uint32_t*              ysize,
    exr_tile_level_mode_t* level,
    exr_tile_round_mode_t* round)
{
    EXR_LOCK_WRITE_AND_DEFINE_PART (part_index);

    if (part->tiles)
    {
        const exr_attr_tiledesc_t* out = part->tiles->tiledesc;

        if (part->tiles->type != EXR_ATTR_TILEDESC)
            return EXR_UNLOCK_WRITE_AND_RETURN (ctxt->print_error (
                ctxt,
                EXR_ERR_FILE_BAD_HEADER,
                "Invalid required attribute type '%s' for 'tiles'",
                part->tiles->type_name));

        if (xsize) *xsize = out->x_size;
        if (ysize) *ysize = out->y_size;
        if (level) *level = EXR_GET_TILE_LEVEL_MODE (*out);
        if (round) *round = EXR_GET_TILE_ROUND_MODE (*out);
        return EXR_UNLOCK_WRITE_AND_RETURN (EXR_ERR_SUCCESS);
    }
    return EXR_UNLOCK_WRITE_AND_RETURN (EXR_ERR_NO_ATTR_BY_NAME);
}